

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall dgrminer::PartialUnion::debug_printNodes(PartialUnion *this)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  size_t j;
  long lVar4;
  
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)(this->nodes).
                             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->nodes).
                            super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar2 = uVar2 + 1) {
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)((long)((this->nodes).
                                          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                  lVar4 * 4 + lVar3));
      std::operator<<(poVar1,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void PartialUnion::debug_printNodes()
	{
		for (size_t i = 0; i < nodes.size(); i++)
		{
			for (size_t j = 0; j < nodes[i].size(); j++)
			{
				std::cout << nodes[i][j] << "\t";
			}
			std::cout << std::endl;
		}
	}